

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitArrayNew(OptimizeInstructions *this,ArrayNew *curr)

{
  Type *this_00;
  Id IVar1;
  Expression *pEVar2;
  PassRunner *pPVar3;
  Module *module;
  element_type *peVar4;
  bool bVar5;
  HeapType type_00;
  ArrayNewFixed *rep;
  element_type *curr_00;
  Expression **ppEVar6;
  Drop *this_01;
  Block *rep_00;
  ulong uVar7;
  optional<wasm::Type> type_01;
  Type local_78;
  Type type;
  Literal zero;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  Builder local_38;
  Builder builder;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id != 1) &&
     (curr->init != (Expression *)0x0)) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type;
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    pEVar2 = curr->size;
    if (pEVar2->_id == ConstId) {
      if (*(long *)(pEVar2 + 2) != 2) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      if (*(int *)(pEVar2 + 1) == 1) {
        type_00 = wasm::Type::getHeapType(this_00);
        local_50.i64 = (int64_t)curr->init;
        type.id = (uintptr_t)&local_50;
        rep = Builder::makeArrayNewFixed<std::initializer_list<wasm::Expression*>>
                        (&local_38,type_00,(initializer_list<wasm::Expression_*> *)&type);
        replaceCurrent(this,(Expression *)rep);
        return;
      }
    }
    local_50.i64 = (int64_t)wasm::Type::getHeapType(this_00);
    HeapType::getArray((HeapType *)&type);
    local_78.id = type.id;
    bVar5 = wasm::Type::isDefaultable(&local_78);
    if (bVar5) {
      Literal::makeZero((Literal *)&type,local_78);
      pPVar3 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner;
      module = (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule;
      peVar4 = (element_type *)curr->init;
      do {
        curr_00 = peVar4;
        local_50.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             curr_00;
        ppEVar6 = Properties::getImmediateFallthroughPtr
                            ((Expression **)&local_50.i64,&pPVar3->options,module,AllowTeeBrIf);
        peVar4 = (element_type *)*ppEVar6;
      } while ((element_type *)*ppEVar6 != curr_00);
      IVar1 = *(Id *)&(curr_00->type).id;
      peVar4 = curr_00;
      while (IVar1 == RefAsId) {
        if (1 < (peVar4->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i32
                - 1U) goto LAB_009d3448;
        peVar4 = (element_type *)
                 (peVar4->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                 gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        IVar1 = *(Id *)&(peVar4->type).id;
      }
      uVar7 = (ulong)(IVar1 - 0x29);
      if (((IVar1 - 0x29 < 0x2b) && ((0x40000000005U >> (uVar7 & 0x3f) & 1) != 0)) ||
         (IVar1 == ConstId)) {
        Properties::getLiteral((Literal *)&local_50.func,(Expression *)curr_00);
        bVar5 = Literal::operator!=((Literal *)&local_50.func,(Literal *)&type);
        Literal::~Literal((Literal *)&local_50.func);
        if (!bVar5) {
          pEVar2 = curr->init;
          curr->init = (Expression *)0x0;
          this_01 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
          (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_01->value = pEVar2;
          Drop::finalize(this_01);
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar7;
          rep_00 = Builder::makeSequence(&local_38,(Expression *)this_01,(Expression *)curr,type_01)
          ;
          replaceCurrent(this,(Expression *)rep_00);
        }
      }
LAB_009d3448:
      Literal::~Literal((Literal *)&type);
    }
  }
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    // If a value is provided, we can optimize in some cases.
    if (curr->type == Type::unreachable || curr->isWithDefault()) {
      return;
    }

    Builder builder(*getModule());

    // ArrayNew of size 1 is less efficient than ArrayNewFixed with one value
    // (the latter avoids a Const, which ends up saving one byte).
    // TODO: also look at the case with a fallthrough or effects on the size
    if (auto* c = curr->size->dynCast<Const>()) {
      if (c->value.geti32() == 1) {
        // Optimize to ArrayNewFixed. Note that if the value is the default
        // then we may end up optimizing further in visitArrayNewFixed.
        replaceCurrent(
          builder.makeArrayNewFixed(curr->type.getHeapType(), {curr->init}));
        return;
      }
    }

    // If the type is defaultable then perhaps the value here is the default.
    auto type = curr->type.getHeapType().getArray().element.type;
    if (!type.isDefaultable()) {
      return;
    }

    // The value must be the default/zero.
    auto zero = Literal::makeZero(type);
    auto* value = getFallthrough(curr->init);
    if (!Properties::isSingleConstantExpression(value) ||
        Properties::getLiteral(value) != zero) {
      return;
    }

    // Success! Drop the init and return an array.new_with_default.
    auto* init = curr->init;
    curr->init = nullptr;
    assert(curr->isWithDefault());
    replaceCurrent(builder.makeSequence(builder.makeDrop(init), curr));
  }